

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CMU462::Matrix3x3::operator-(Matrix3x3 *this,Matrix3x3 *B)

{
  double *pdVar1;
  Matrix3x3 *in_RDI;
  int j;
  int i;
  Matrix3x3 *A;
  Matrix3x3 *C;
  double in_stack_ffffffffffffffb8;
  Matrix3x3 *in_stack_ffffffffffffffc0;
  undefined4 local_28;
  undefined4 local_24;
  
  Matrix3x3(in_RDI);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      in_stack_ffffffffffffffb8 = *pdVar1;
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      in_stack_ffffffffffffffc0 = (Matrix3x3 *)(in_stack_ffffffffffffffb8 - *pdVar1);
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      *pdVar1 = (double)in_stack_ffffffffffffffc0;
    }
  }
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = A(i,j) - B(i,j);
    }

    return C;
  }